

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_emptyTreeSeek_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::ARTIteratorTest_emptyTreeSeek_Test
          (ARTIteratorTest_emptyTreeSeek_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTIteratorTest_emptyTreeSeek_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ARTIteratorTest<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  ARTIteratorTest(&this->
                   super_ARTIteratorTest<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 );
  (this->
  super_ARTIteratorTest<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__ARTIteratorTest_emptyTreeSeek_Test_00382680;
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, emptyTreeSeek) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           true /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           false /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
}